

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::ParseLiteral
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,EncodedChar *input,
          EncodedChar *inputLim,CharCount *outBodyEncodedChars,CharCount *outTotalEncodedChars,
          CharCount *outBodyChars,CharCount *outTotalChars,RegexFlags *flags)

{
  RegexFlags RVar1;
  Char *ph;
  code *pcVar2;
  HRESULT HVar3;
  bool bVar4;
  CharCount CVar5;
  CharCount CVar6;
  undefined4 *puVar7;
  Node *pNVar8;
  ParseError *pPVar9;
  
  if (input == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb40,"(input != 0)","input != 0");
    if (!bVar4) goto LAB_00d290c9;
    *puVar7 = 0;
  }
  if (inputLim < input) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb41,"(inputLim >= input)","inputLim >= input");
    if (!bVar4) goto LAB_00d290c9;
    *puVar7 = 0;
  }
  this->input = input;
  this->inputLim = inputLim;
  this->next = input;
  this->inBody = true;
  PatternPass0(this);
  CVar5 = Chars<char16_t>::OSB(this->next,input);
  *outBodyEncodedChars = CVar5;
  CVar5 = Pos(this);
  *outBodyChars = CVar5;
  ECMust(this,L'/',-0x7ff5fc0c);
  Options(this,flags);
  RVar1 = *flags;
  bVar4 = (bool)(RVar1 >> 3 & 1);
  this->unicodeFlagPresent = bVar4;
  this->caseInsensitiveFlagPresent = (bool)(RVar1 & IgnoreCaseRegexFlag);
  this->dotAllFlagPresent = (bool)(RVar1 >> 5 & 1);
  if ((bVar4 != false) && (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb54,
                       "(!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())"
                       ,
                       "!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()"
                      );
    if (!bVar4) goto LAB_00d290c9;
    *puVar7 = 0;
  }
  if ((this->deferredIfNotUnicodeError != (ParseError *)0x0) && (this->unicodeFlagPresent == false))
  {
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar9 = this->deferredIfNotUnicodeError;
LAB_00d290eb:
    CVar5 = pPVar9->pos;
    CVar6 = pPVar9->encodedPos;
    HVar3 = pPVar9->error;
    *puVar7 = *(undefined4 *)pPVar9;
    puVar7[1] = CVar5;
    puVar7[2] = CVar6;
    puVar7[3] = HVar3;
    __cxa_throw(puVar7,&ParseError::typeinfo,0);
  }
  if ((this->deferredIfUnicodeError != (ParseError *)0x0) && (this->unicodeFlagPresent == true)) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar9 = this->deferredIfUnicodeError;
    goto LAB_00d290eb;
  }
  ph = this->next;
  this->currentSurrogatePairNode = this->surrogatePairList;
  this->input = input;
  this->inputLim = inputLim;
  this->next = input;
  this->inBody = true;
  pNVar8 = DisjunctionPass1(this);
  CVar5 = *outBodyEncodedChars;
  CVar6 = Chars<char16_t>::OSB(this->next,input);
  if (CVar5 != CVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb68,"(outBodyEncodedChars == Chars<EncodedChar>::OSB(next, input))",
                       "outBodyEncodedChars == Chars<EncodedChar>::OSB(next, input)");
    if (!bVar4) goto LAB_00d290c9;
    *puVar7 = 0;
  }
  CVar5 = *outBodyChars;
  CVar6 = Pos(this);
  if (CVar5 != CVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb69,"(outBodyChars == Pos())","outBodyChars == Pos()");
    if (!bVar4) {
LAB_00d290c9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  this->next = ph;
  CVar5 = Chars<char16_t>::OSB(ph,input);
  *outTotalEncodedChars = CVar5;
  CVar5 = Pos(this);
  *outTotalChars = CVar5;
  return pNVar8;
}

Assistant:

Node* Parser<P, IsLiteral>::ParseLiteral
        ( const EncodedChar* input
        , const EncodedChar* inputLim
        , CharCount& outBodyEncodedChars
        , CharCount& outTotalEncodedChars
        , CharCount& outBodyChars
        , CharCount& outTotalChars
        , RegexFlags& flags )
    {
        Assert(IsLiteral);
        Assert(input != 0);
        Assert(inputLim >= input); // *inputLim need not be 0 because of deferred parsing

        // To handle surrogate pairs properly under unicode option, we will collect information on location of the pairs
        // during pass 0, regardless if the option is present. (We aren't able to get it at that time)
        // During pass 1, we will use that information to correctly create appropriate nodes.

        // Body, pass 0
        SetPosition(input, inputLim, true);

        PatternPass0();
        outBodyEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outBodyChars = Pos();

        // Options are needed for the next pass
        ECMust('/', ERRnoSlash);
        Options(flags);
        this->unicodeFlagPresent = (flags & UnifiedRegex::UnicodeRegexFlag) == UnifiedRegex::UnicodeRegexFlag;
        this->caseInsensitiveFlagPresent = (flags & UnifiedRegex::IgnoreCaseRegexFlag) == UnifiedRegex::IgnoreCaseRegexFlag;
        this->dotAllFlagPresent = (flags & UnifiedRegex::DotAllRegexFlag) == UnifiedRegex::DotAllRegexFlag;
        Assert(!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        // If this HR has been set, that means we have an earlier failure than the one caught above.
        if (this->deferredIfNotUnicodeError != nullptr && !this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfNotUnicodeError);
        }
        else if(this->deferredIfUnicodeError != nullptr && this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfUnicodeError);
        }

        // Used below to proceed to the end of the regex
        const EncodedChar *pastOptions = next;

        this->currentSurrogatePairNode = this->surrogatePairList;

        // Body, pass 1
        SetPosition(input, inputLim, true);
        Node* root = PatternPass1();
        Assert(outBodyEncodedChars == Chars<EncodedChar>::OSB(next, input));
        Assert(outBodyChars == Pos());

        next = pastOptions;
        outTotalEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outTotalChars = Pos();

        return root;
    }